

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner.cpp
# Opt level: O3

unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> __thiscall
node::BlockAssembler::CreateNewBlock(BlockAssembler *this,CScript *scriptPubKeyIn)

{
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *this_00;
  pointer *ppsVar1;
  long *args;
  undefined1 *puVar2;
  undefined8 uVar3;
  CBlockTemplate *__ptr;
  iterator __position;
  char *pcVar4;
  iterator iVar5;
  pointer psVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  void *pvVar7;
  uint256 *puVar8;
  uint uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  string_view source_file;
  string_view source_file_00;
  base_blob<256U> *pbVar12;
  _Alloc_hider _Var13;
  bool bVar14;
  int32_t iVar15;
  uint uVar16;
  long lVar17;
  CBlock *block;
  int64_t iVar18;
  time_point tVar19;
  long lVar20;
  CAmount CVar21;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_02;
  Logger *pLVar22;
  long lVar23;
  runtime_error *this_03;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_RDX;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar24;
  CBlockIndex *pindexPrev;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string_view logging_function;
  string_view logging_function_00;
  CMutableTransaction coinbaseTx;
  int nDescendantsUpdated;
  int nPackagesSelected;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock10;
  BlockValidationState state;
  string log_msg_1;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  char *in_stack_fffffffffffffe30;
  double local_198;
  double local_190;
  double local_188;
  CMutableTransaction local_180;
  int local_144;
  double local_140;
  unique_lock<std::recursive_mutex> local_138;
  undefined1 local_128 [16];
  undefined1 local_118 [24];
  _Alloc_hider local_100;
  size_type local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  char *local_d8 [12];
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar17 = std::chrono::_V2::steady_clock::now();
  std::
  _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear((_Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)((long)&scriptPubKeyIn[1].super_CScriptBase._union + 8));
  uVar3 = *(undefined8 *)((long)&scriptPubKeyIn[5].super_CScriptBase._union + 8);
  *(char **)((long)&(scriptPubKeyIn->super_CScriptBase)._union + 8) =
       scriptPubKeyIn[5].super_CScriptBase._union.indirect_contents.indirect;
  *(undefined8 *)((long)&(scriptPubKeyIn->super_CScriptBase)._union + 0x18) = uVar3;
  *(undefined8 *)((long)&(scriptPubKeyIn->super_CScriptBase)._union + 0x10) = 0;
  scriptPubKeyIn[1].super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  block = (CBlock *)operator_new(0xb8);
  memset(block,0,0xb8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::clear(&block->vtx);
  block->fChecked = false;
  block->m_checked_witness_commitment = false;
  block->m_checked_merkle_root = false;
  block[1].super_CBlockHeader.nVersion = 0;
  block[1].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  block[1].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block[1].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block[1].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  pbVar12 = &block[1].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>;
  (pbVar12->m_data)._M_elems[4] = '\0';
  (pbVar12->m_data)._M_elems[5] = '\0';
  (pbVar12->m_data)._M_elems[6] = '\0';
  (pbVar12->m_data)._M_elems[7] = '\0';
  (pbVar12->m_data)._M_elems[8] = '\0';
  (pbVar12->m_data)._M_elems[9] = '\0';
  (pbVar12->m_data)._M_elems[10] = '\0';
  (pbVar12->m_data)._M_elems[0xb] = '\0';
  pbVar12 = &block[1].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>;
  (pbVar12->m_data)._M_elems[0xc] = '\0';
  (pbVar12->m_data)._M_elems[0xd] = '\0';
  (pbVar12->m_data)._M_elems[0xe] = '\0';
  (pbVar12->m_data)._M_elems[0xf] = '\0';
  (pbVar12->m_data)._M_elems[0x10] = '\0';
  (pbVar12->m_data)._M_elems[0x11] = '\0';
  (pbVar12->m_data)._M_elems[0x12] = '\0';
  (pbVar12->m_data)._M_elems[0x13] = '\0';
  pbVar12 = &block[1].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>;
  (pbVar12->m_data)._M_elems[0x14] = '\0';
  (pbVar12->m_data)._M_elems[0x15] = '\0';
  (pbVar12->m_data)._M_elems[0x16] = '\0';
  (pbVar12->m_data)._M_elems[0x17] = '\0';
  (pbVar12->m_data)._M_elems[0x18] = '\0';
  (pbVar12->m_data)._M_elems[0x19] = '\0';
  (pbVar12->m_data)._M_elems[0x1a] = '\0';
  (pbVar12->m_data)._M_elems[0x1b] = '\0';
  *(undefined8 *)
   (block[1].super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x1c) = 0;
  pbVar12 = &block[1].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>;
  (pbVar12->m_data)._M_elems[4] = '\0';
  (pbVar12->m_data)._M_elems[5] = '\0';
  (pbVar12->m_data)._M_elems[6] = '\0';
  (pbVar12->m_data)._M_elems[7] = '\0';
  (pbVar12->m_data)._M_elems[8] = '\0';
  (pbVar12->m_data)._M_elems[9] = '\0';
  (pbVar12->m_data)._M_elems[10] = '\0';
  (pbVar12->m_data)._M_elems[0xb] = '\0';
  pbVar12 = &block[1].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>;
  (pbVar12->m_data)._M_elems[0xc] = '\0';
  (pbVar12->m_data)._M_elems[0xd] = '\0';
  (pbVar12->m_data)._M_elems[0xe] = '\0';
  (pbVar12->m_data)._M_elems[0xf] = '\0';
  (pbVar12->m_data)._M_elems[0x10] = '\0';
  (pbVar12->m_data)._M_elems[0x11] = '\0';
  (pbVar12->m_data)._M_elems[0x12] = '\0';
  (pbVar12->m_data)._M_elems[0x13] = '\0';
  pbVar12 = &block[1].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>;
  (pbVar12->m_data)._M_elems[0x14] = '\0';
  (pbVar12->m_data)._M_elems[0x15] = '\0';
  (pbVar12->m_data)._M_elems[0x16] = '\0';
  (pbVar12->m_data)._M_elems[0x17] = '\0';
  (pbVar12->m_data)._M_elems[0x18] = '\0';
  (pbVar12->m_data)._M_elems[0x19] = '\0';
  (pbVar12->m_data)._M_elems[0x1a] = '\0';
  (pbVar12->m_data)._M_elems[0x1b] = '\0';
  *(undefined8 *)
   (block[1].super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1c) = 0;
  __ptr = (CBlockTemplate *)(scriptPubKeyIn->super_CScriptBase)._union.indirect_contents.indirect;
  *(CBlock **)&(scriptPubKeyIn->super_CScriptBase)._union = block;
  if (__ptr == (CBlockTemplate *)0x0) {
LAB_0096d208:
    this_00 = &block->vtx;
    __position._M_current =
         (block->vtx).
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (block->vtx).
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::_M_realloc_insert<>(this_00,__position);
    }
    else {
      ((__position._M_current)->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr = (element_type *)0x0;
      ((__position._M_current)->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ppsVar1 = &(block->vtx).
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppsVar1 = *ppsVar1 + 1;
    }
    pcVar4 = (scriptPubKeyIn->super_CScriptBase)._union.indirect_contents.indirect;
    local_128._0_8_ = (pointer)0xffffffffffffffff;
    iVar5._M_current = *(long **)(pcVar4 + 0x78);
    if (iVar5._M_current == *(long **)(pcVar4 + 0x80)) {
      std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                ((vector<long,_std::allocator<long>_> *)(pcVar4 + 0x70),iVar5,(long *)local_128);
    }
    else {
      *iVar5._M_current = -1;
      *(long **)(pcVar4 + 0x78) = iVar5._M_current + 1;
    }
    pcVar4 = (scriptPubKeyIn->super_CScriptBase)._union.indirect_contents.indirect;
    local_128._0_8_ = (pointer)0xffffffffffffffff;
    iVar5._M_current = *(long **)(pcVar4 + 0x90);
    if (iVar5._M_current == *(long **)(pcVar4 + 0x98)) {
      std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                ((vector<long,_std::allocator<long>_> *)(pcVar4 + 0x88),iVar5,(long *)local_128);
    }
    else {
      *iVar5._M_current = -1;
      *(long **)(pcVar4 + 0x90) = iVar5._M_current + 1;
    }
    local_138._M_device = &cs_main.super_recursive_mutex;
    local_138._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_138);
    lVar20 = *(long *)((long)&scriptPubKeyIn[4].super_CScriptBase._union + 0x10);
    if ((*(long *)(lVar20 + 0x60) == *(long *)(lVar20 + 0x58)) ||
       (pindexPrev = *(CBlockIndex **)(*(long *)(lVar20 + 0x60) + -8),
       pindexPrev == (CBlockIndex *)0x0)) {
      __assert_fail("pindexPrev != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/miner.cpp"
                    ,0x81,
                    "std::unique_ptr<CBlockTemplate> node::BlockAssembler::CreateNewBlock(const CScript &)"
                   );
    }
    *(int *)((long)&scriptPubKeyIn[3].super_CScriptBase._union + 0x10) = pindexPrev->nHeight + 1;
    iVar15 = VersionBitsCache::ComputeBlockVersion
                       ((VersionBitsCache *)(*(long *)(lVar20 + 0x50) + 0xd08),pindexPrev,
                        (Params *)
                        scriptPubKeyIn[4].super_CScriptBase._union.indirect_contents.indirect);
    (block->super_CBlockHeader).nVersion = iVar15;
    if (scriptPubKeyIn[4].super_CScriptBase._union.indirect_contents.indirect[0xfa] == '\x01') {
      local_128._0_8_ = local_118;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"-blockversion","");
      iVar18 = ArgsManager::GetIntArg
                         (&gArgs,(string *)local_128,(long)(block->super_CBlockHeader).nVersion);
      (block->super_CBlockHeader).nVersion = (int32_t)iVar18;
      if ((undefined1 *)local_128._0_8_ != local_118) {
        operator_delete((void *)local_128._0_8_,local_118._0_8_ + 1);
      }
    }
    tVar19 = NodeClock::now();
    (block->super_CBlockHeader).nTime =
         (int)(SUB168(SEXT816((long)tVar19.__d.__r) * SEXT816(0x112e0be826d694b3),8) >> 0x1a) -
         (SUB164(SEXT816((long)tVar19.__d.__r) * SEXT816(0x112e0be826d694b3),0xc) >> 0x1f);
    iVar18 = CBlockIndex::GetMedianTimePast(pindexPrev);
    *(int64_t *)((long)&scriptPubKeyIn[3].super_CScriptBase._union + 0x18) = iVar18;
    local_140._0_4_ = 0;
    local_144 = 0;
    lVar20 = *(long *)((long)&scriptPubKeyIn[4].super_CScriptBase._union + 8);
    if (lVar20 != 0) {
      local_128._0_8_ = lVar20 + 0x58;
      local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
      std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_128);
      addPackageTxs((BlockAssembler *)scriptPubKeyIn,
                    *(CTxMemPool **)((long)&scriptPubKeyIn[4].super_CScriptBase._union + 8),
                    (int *)&local_140,&local_144);
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)local_128);
    }
    args = (long *)((scriptPubKeyIn->super_CScriptBase)._union.direct + 0x10);
    lVar20 = std::chrono::_V2::steady_clock::now();
    m_last_block_num_txs.super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_payload._M_value = *args;
    if (m_last_block_num_txs.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged == false) {
      m_last_block_num_txs.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_engaged = true;
    }
    m_last_block_weight.super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_payload =
         *(_Storage<long,_true> *)((long)&(scriptPubKeyIn->super_CScriptBase)._union + 8);
    if (m_last_block_weight.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged == false) {
      m_last_block_weight.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_engaged = true;
    }
    CMutableTransaction::CMutableTransaction(&local_180);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&local_180.vin,1);
    pbVar12 = &((local_180.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>;
    (pbVar12->m_data)._M_elems[0x10] = '\0';
    (pbVar12->m_data)._M_elems[0x11] = '\0';
    (pbVar12->m_data)._M_elems[0x12] = '\0';
    (pbVar12->m_data)._M_elems[0x13] = '\0';
    (pbVar12->m_data)._M_elems[0x14] = '\0';
    (pbVar12->m_data)._M_elems[0x15] = '\0';
    (pbVar12->m_data)._M_elems[0x16] = '\0';
    (pbVar12->m_data)._M_elems[0x17] = '\0';
    pbVar12 = &((local_180.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>;
    (pbVar12->m_data)._M_elems[0x18] = '\0';
    (pbVar12->m_data)._M_elems[0x19] = '\0';
    (pbVar12->m_data)._M_elems[0x1a] = '\0';
    (pbVar12->m_data)._M_elems[0x1b] = '\0';
    (pbVar12->m_data)._M_elems[0x1c] = '\0';
    (pbVar12->m_data)._M_elems[0x1d] = '\0';
    (pbVar12->m_data)._M_elems[0x1e] = '\0';
    (pbVar12->m_data)._M_elems[0x1f] = '\0';
    puVar8 = &((local_180.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->prevout).hash.m_wrapped;
    (puVar8->super_base_blob<256U>).m_data._M_elems[0] = '\0';
    (puVar8->super_base_blob<256U>).m_data._M_elems[1] = '\0';
    (puVar8->super_base_blob<256U>).m_data._M_elems[2] = '\0';
    (puVar8->super_base_blob<256U>).m_data._M_elems[3] = '\0';
    (puVar8->super_base_blob<256U>).m_data._M_elems[4] = '\0';
    (puVar8->super_base_blob<256U>).m_data._M_elems[5] = '\0';
    (puVar8->super_base_blob<256U>).m_data._M_elems[6] = '\0';
    (puVar8->super_base_blob<256U>).m_data._M_elems[7] = '\0';
    pbVar12 = &((local_180.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>;
    (pbVar12->m_data)._M_elems[8] = '\0';
    (pbVar12->m_data)._M_elems[9] = '\0';
    (pbVar12->m_data)._M_elems[10] = '\0';
    (pbVar12->m_data)._M_elems[0xb] = '\0';
    (pbVar12->m_data)._M_elems[0xc] = '\0';
    (pbVar12->m_data)._M_elems[0xd] = '\0';
    (pbVar12->m_data)._M_elems[0xe] = '\0';
    (pbVar12->m_data)._M_elems[0xf] = '\0';
    ((local_180.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).n = 0xffffffff;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&local_180.vout,1);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&((local_180.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,in_RDX);
    pcVar4 = scriptPubKeyIn[1].super_CScriptBase._union.indirect_contents.indirect;
    CVar21 = GetBlockSubsidy(*(int *)((long)&scriptPubKeyIn[3].super_CScriptBase._union + 0x10),
                             (Params *)
                             scriptPubKeyIn[4].super_CScriptBase._union.indirect_contents.indirect);
    (local_180.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
     super__Vector_impl_data._M_start)->nValue = (CAmount)(pcVar4 + CVar21);
    local_118._0_8_ = 0;
    local_118._8_8_ = 0;
    local_128._0_8_ = (pointer)0x0;
    local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_02 = &CScript::push_int64((CScript *)local_128,
                                   (long)*(int *)((long)&scriptPubKeyIn[3].super_CScriptBase._union
                                                 + 0x10))->super_CScriptBase;
    uVar16 = this_02->_size;
    uVar9 = uVar16 - 0x1d;
    if (uVar16 < 0x1d) {
      uVar9 = uVar16;
    }
    ppVar24 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
              (this_02->_union).indirect_contents.indirect;
    if (uVar16 < 0x1d) {
      ppVar24 = this_02;
    }
    local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffffffffff00;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              (this_02,(uchar *)((long)&ppVar24->_union + (long)(int)uVar9),(uchar *)&local_58);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&((local_180.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,this_02);
    if (0x1c < (uint)local_118._12_4_) {
      free((void *)local_128._0_8_);
    }
    local_128._0_8_ = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8),
               (CTransaction **)local_128,(allocator<CTransaction> *)&local_58,&local_180);
    uVar10 = local_128._8_8_;
    uVar3 = local_128._0_8_;
    psVar6 = (this_00->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_128._0_8_ = (pointer)0x0;
    local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_01 = (psVar6->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    (psVar6->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)uVar3;
    (psVar6->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
    }
    ChainstateManager::GenerateCoinbaseCommitment
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128,
               *(ChainstateManager **)
                (*(long *)((long)&scriptPubKeyIn[4].super_CScriptBase._union + 0x10) + 0x50),block,
               pindexPrev);
    pcVar4 = (scriptPubKeyIn->super_CScriptBase)._union.indirect_contents.indirect;
    pvVar7 = *(void **)(pcVar4 + 0xa0);
    lVar23 = *(long *)(pcVar4 + 0xb0);
    *(undefined8 *)(pcVar4 + 0xa0) = local_128._0_8_;
    *(undefined8 *)(pcVar4 + 0xa8) = local_128._8_8_;
    *(undefined8 *)(pcVar4 + 0xb0) = local_118._0_8_;
    local_128._0_8_ = (pointer)0x0;
    local_128._8_8_ = 0;
    local_118._0_8_ = 0;
    if (pvVar7 != (void *)0x0) {
      operator_delete(pvVar7,lVar23 - (long)pvVar7);
      if ((pointer)local_128._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_128._0_8_,local_118._0_8_ - local_128._0_8_);
      }
    }
    **(long **)((scriptPubKeyIn->super_CScriptBase)._union.indirect_contents.indirect + 0x70) =
         -(long)scriptPubKeyIn[1].super_CScriptBase._union.indirect_contents.indirect;
    local_128._0_8_ = &::TX_NO_WITNESS;
    local_58._M_dataplus._M_p = &DAT_00000050;
    local_128._8_8_ = (allocator<CTransaction> *)&local_58;
    VectorFormatter<DefaultFormatter>::
    Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>
              ((VectorFormatter<DefaultFormatter> *)&local_78,
               (ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_128,this_00);
    _Var13._M_p = local_58._M_dataplus._M_p;
    local_128._0_8_ = &::TX_WITH_WITNESS;
    local_58._M_dataplus._M_p = &DAT_00000050;
    local_128._8_8_ = (allocator<CTransaction> *)&local_58;
    VectorFormatter<DefaultFormatter>::
    Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>
              ((VectorFormatter<DefaultFormatter> *)&local_78,
               (ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_128,this_00);
    local_d8[0] = local_58._M_dataplus._M_p + (long)_Var13._M_p * 3;
    pLVar22 = LogInstance();
    bVar14 = BCLog::Logger::Enabled(pLVar22);
    if (bVar14) {
      local_128._8_8_ = (allocator<CTransaction> *)0x0;
      local_118._0_8_ = local_118._0_8_ & 0xffffffffffffff00;
      local_128._0_8_ = (TransactionSerParams *)local_118;
      tinyformat::format<long,unsigned_long,long,unsigned_long>
                (&local_58,
                 (tinyformat *)"CreateNewBlock(): block weight: %u txs: %u fees: %ld sigops %d\n",
                 (char *)local_d8,args,(unsigned_long *)(scriptPubKeyIn + 1),
                 (long *)((scriptPubKeyIn->super_CScriptBase)._union.direct + 0x18),
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                 &local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      pLVar22 = LogInstance();
      local_58._M_dataplus._M_p = (pointer)0x57;
      local_58._M_string_length = 0xfbe9ee;
      in_stack_fffffffffffffe30 =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/miner.cpp"
      ;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/miner.cpp"
      ;
      source_file._M_len = 0x57;
      str._M_str = (char *)local_128._0_8_;
      str._M_len = local_128._8_8_;
      logging_function._M_str = "CreateNewBlock";
      logging_function._M_len = 0xe;
      BCLog::Logger::LogPrintStr(pLVar22,str,logging_function,source_file,0xa6,ALL,Info);
      if ((TransactionSerParams *)local_128._0_8_ != (TransactionSerParams *)local_118) {
        operator_delete((void *)local_128._0_8_,local_118._0_8_ + 1);
      }
    }
    puVar8 = pindexPrev->phashBlock;
    if (puVar8 == (uint256 *)0x0) {
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
    uVar3 = *(undefined8 *)(puVar8->super_base_blob<256U>).m_data._M_elems;
    uVar10 = *(undefined8 *)((puVar8->super_base_blob<256U>).m_data._M_elems + 8);
    uVar11 = *(undefined8 *)((puVar8->super_base_blob<256U>).m_data._M_elems + 0x18);
    *(undefined8 *)
     ((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x10) =
         *(undefined8 *)((puVar8->super_base_blob<256U>).m_data._M_elems + 0x10);
    *(undefined8 *)
     ((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x18) =
         uVar11;
    *(undefined8 *)(block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems =
         uVar3;
    *(undefined8 *)
     ((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 8) = uVar10;
    UpdateTime(&block->super_CBlockHeader,
               (Params *)scriptPubKeyIn[4].super_CScriptBase._union.indirect_contents.indirect,
               pindexPrev);
    uVar16 = GetNextWorkRequired(pindexPrev,&block->super_CBlockHeader,
                                 (Params *)
                                 scriptPubKeyIn[4].super_CScriptBase._union.indirect_contents.
                                 indirect);
    (block->super_CBlockHeader).nBits = uVar16;
    (block->super_CBlockHeader).nNonce = 0;
    uVar16 = GetLegacySigOpCount((((block->vtx).
                                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                                 ._M_ptr);
    **(ulong **)((scriptPubKeyIn->super_CScriptBase)._union.indirect_contents.indirect + 0x88) =
         (ulong)(uVar16 << 2);
    puVar2 = local_118 + 8;
    local_128._0_8_ = (pointer)0x0;
    local_118._0_8_ = 0;
    local_118._8_8_ = local_118._8_8_ & 0xffffffffffffff00;
    local_f8 = 0;
    local_f0._M_local_buf[0] = '\0';
    local_128._8_8_ = puVar2;
    local_100._M_p = (pointer)&local_f0;
    if (scriptPubKeyIn[6].super_CScriptBase._union.direct[0] == '\x01') {
      bVar14 = TestBlockValidity((BlockValidationState *)local_128,
                                 (CChainParams *)
                                 scriptPubKeyIn[4].super_CScriptBase._union.indirect_contents.
                                 indirect,*(Chainstate **)
                                           ((long)&scriptPubKeyIn[4].super_CScriptBase._union + 0x10
                                           ),block,pindexPrev,false,false);
      if (!bVar14) {
        this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
        ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                  (&local_78,(ValidationState<BlockValidationResult> *)local_128);
        tinyformat::format<char[15],std::__cxx11::string>
                  (&local_58,(tinyformat *)"%s: TestBlockValidity failed: %s","CreateNewBlock",
                   (char (*) [15])&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pindexPrev);
        std::runtime_error::runtime_error(this_03,(string *)&local_58);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_0096e296;
      }
    }
    lVar23 = std::chrono::_V2::steady_clock::now();
    pLVar22 = LogInstance();
    bVar14 = BCLog::Logger::WillLogCategoryLevel(pLVar22,BENCH,Debug);
    if (bVar14) {
      local_188 = (double)(lVar20 - lVar17) / 1000000.0;
      local_190 = (double)(lVar23 - lVar20) / 1000000.0;
      local_198 = (double)(lVar23 - lVar17) / 1000000.0;
      pLVar22 = LogInstance();
      bVar14 = BCLog::Logger::Enabled(pLVar22);
      if (bVar14) {
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        tinyformat::format<double,int,int,double,double>
                  (&local_78,
                   (tinyformat *)
                   "CreateNewBlock() packages: %.2fms (%d packages, %d updated descendants), validity: %.2fms (total %.2fms)\n"
                   ,(char *)&local_188,&local_140,&local_144,(int *)&local_190,&local_198,
                   (double *)in_stack_fffffffffffffe30);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_58,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        pLVar22 = LogInstance();
        local_78._M_dataplus._M_p = (pointer)0x57;
        local_78._M_string_length = 0xfbe9ee;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/miner.cpp"
        ;
        source_file_00._M_len = 0x57;
        str_00._M_str = local_58._M_dataplus._M_p;
        str_00._M_len = local_58._M_string_length;
        logging_function_00._M_str = "CreateNewBlock";
        logging_function_00._M_len = 0xe;
        BCLog::Logger::LogPrintStr
                  (pLVar22,str_00,logging_function_00,source_file_00,0xb9,BENCH,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                   local_58.field_2._M_local_buf[0]) + 1);
        }
      }
    }
    (this->pblocktemplate)._M_t.
    super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
    super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
    super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
         (CBlockTemplate *)(scriptPubKeyIn->super_CScriptBase)._union.indirect_contents.indirect;
    (scriptPubKeyIn->super_CScriptBase)._union.indirect_contents.indirect = (char *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_p != &local_f0) {
      operator_delete(local_100._M_p,
                      CONCAT71(local_f0._M_allocated_capacity._1_7_,local_f0._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_128._8_8_ != puVar2) {
      operator_delete((void *)local_128._8_8_,local_118._8_8_ + 1);
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_180.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_180.vin);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_138);
  }
  else {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)scriptPubKeyIn,__ptr);
    block = (CBlock *)(scriptPubKeyIn->super_CScriptBase)._union.indirect_contents.indirect;
    if (block != (CBlock *)0x0) goto LAB_0096d208;
    (this->pblocktemplate)._M_t.
    super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
    super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
    super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl = (CBlockTemplate *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
            )(__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
              )this;
  }
LAB_0096e296:
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<CBlockTemplate> BlockAssembler::CreateNewBlock(const CScript& scriptPubKeyIn)
{
    const auto time_start{SteadyClock::now()};

    resetBlock();

    pblocktemplate.reset(new CBlockTemplate());

    if (!pblocktemplate.get()) {
        return nullptr;
    }
    CBlock* const pblock = &pblocktemplate->block; // pointer for convenience

    // Add dummy coinbase tx as first transaction
    pblock->vtx.emplace_back();
    pblocktemplate->vTxFees.push_back(-1); // updated at end
    pblocktemplate->vTxSigOpsCost.push_back(-1); // updated at end

    LOCK(::cs_main);
    CBlockIndex* pindexPrev = m_chainstate.m_chain.Tip();
    assert(pindexPrev != nullptr);
    nHeight = pindexPrev->nHeight + 1;

    pblock->nVersion = m_chainstate.m_chainman.m_versionbitscache.ComputeBlockVersion(pindexPrev, chainparams.GetConsensus());
    // -regtest only: allow overriding block.nVersion with
    // -blockversion=N to test forking scenarios
    if (chainparams.MineBlocksOnDemand()) {
        pblock->nVersion = gArgs.GetIntArg("-blockversion", pblock->nVersion);
    }

    pblock->nTime = TicksSinceEpoch<std::chrono::seconds>(NodeClock::now());
    m_lock_time_cutoff = pindexPrev->GetMedianTimePast();

    int nPackagesSelected = 0;
    int nDescendantsUpdated = 0;
    if (m_mempool) {
        LOCK(m_mempool->cs);
        addPackageTxs(*m_mempool, nPackagesSelected, nDescendantsUpdated);
    }

    const auto time_1{SteadyClock::now()};

    m_last_block_num_txs = nBlockTx;
    m_last_block_weight = nBlockWeight;

    // Create coinbase transaction.
    CMutableTransaction coinbaseTx;
    coinbaseTx.vin.resize(1);
    coinbaseTx.vin[0].prevout.SetNull();
    coinbaseTx.vout.resize(1);
    coinbaseTx.vout[0].scriptPubKey = scriptPubKeyIn;
    coinbaseTx.vout[0].nValue = nFees + GetBlockSubsidy(nHeight, chainparams.GetConsensus());
    coinbaseTx.vin[0].scriptSig = CScript() << nHeight << OP_0;
    pblock->vtx[0] = MakeTransactionRef(std::move(coinbaseTx));
    pblocktemplate->vchCoinbaseCommitment = m_chainstate.m_chainman.GenerateCoinbaseCommitment(*pblock, pindexPrev);
    pblocktemplate->vTxFees[0] = -nFees;

    LogPrintf("CreateNewBlock(): block weight: %u txs: %u fees: %ld sigops %d\n", GetBlockWeight(*pblock), nBlockTx, nFees, nBlockSigOpsCost);

    // Fill in header
    pblock->hashPrevBlock  = pindexPrev->GetBlockHash();
    UpdateTime(pblock, chainparams.GetConsensus(), pindexPrev);
    pblock->nBits          = GetNextWorkRequired(pindexPrev, pblock, chainparams.GetConsensus());
    pblock->nNonce         = 0;
    pblocktemplate->vTxSigOpsCost[0] = WITNESS_SCALE_FACTOR * GetLegacySigOpCount(*pblock->vtx[0]);

    BlockValidationState state;
    if (m_options.test_block_validity && !TestBlockValidity(state, chainparams, m_chainstate, *pblock, pindexPrev,
                                                            /*fCheckPOW=*/false, /*fCheckMerkleRoot=*/false)) {
        throw std::runtime_error(strprintf("%s: TestBlockValidity failed: %s", __func__, state.ToString()));
    }
    const auto time_2{SteadyClock::now()};

    LogDebug(BCLog::BENCH, "CreateNewBlock() packages: %.2fms (%d packages, %d updated descendants), validity: %.2fms (total %.2fms)\n",
             Ticks<MillisecondsDouble>(time_1 - time_start), nPackagesSelected, nDescendantsUpdated,
             Ticks<MillisecondsDouble>(time_2 - time_1),
             Ticks<MillisecondsDouble>(time_2 - time_start));

    return std::move(pblocktemplate);
}